

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

void cfd::capi::ConvertToKeyData
               (string *pubkey,char *fingerprint,char *bip32_path,
               vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  pointer puVar3;
  pointer puVar4;
  pointer pAVar5;
  bool bVar6;
  size_t sVar7;
  CfdException *pCVar8;
  Descriptor desc;
  allocator local_492;
  allocator local_491;
  vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>> *local_490;
  undefined1 local_488 [208];
  _Rb_tree_node_base _Stack_3b8;
  pointer local_398;
  pointer puStack_390;
  pointer puStack_388;
  pointer local_380;
  pointer puStack_378;
  pointer puStack_370;
  pointer local_368;
  pointer puStack_360;
  pointer pAStack_358;
  pointer local_350;
  pointer pAStack_348;
  pointer puStack_340;
  undefined1 local_338 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  _Alloc_hider _Stack_318;
  pointer local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  _Alloc_hider _Stack_2f8;
  pointer local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  pointer local_2d8;
  _Alloc_hider _Stack_2d0;
  pointer local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  pointer local_290;
  pointer local_288;
  pointer pDStack_280;
  pointer local_278;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_270;
  _Alloc_hider _Stack_240;
  pointer local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  pointer local_220;
  pointer local_218;
  pointer puStack_210;
  pointer local_208;
  pointer local_200;
  pointer pAStack_1f8;
  _Alloc_hider local_1f0;
  undefined1 local_1c8 [32];
  pointer puStack_1a8;
  pointer local_1a0;
  size_type local_198;
  pointer local_190;
  pointer puStack_188;
  pointer local_180;
  size_type local_178;
  uint8_t uStack_170;
  undefined3 uStack_16f;
  uint32_t uStack_16c;
  pointer local_168;
  pointer puStack_160;
  pointer local_158;
  pointer local_150;
  pointer puStack_148;
  pointer local_140;
  size_type local_138;
  pointer local_130;
  pointer puStack_128;
  pointer local_120;
  pointer local_118;
  pointer pDStack_110;
  pointer local_108;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_100;
  pointer puStack_d0;
  pointer local_c8;
  pointer local_c0;
  pointer puStack_b8;
  pointer local_b0;
  pointer local_a8;
  pointer puStack_a0;
  pointer local_98;
  pointer local_90;
  pointer pAStack_88;
  pointer local_80;
  ByteData local_78;
  Pubkey local_60;
  ByteData local_48;
  
  local_490 = (vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>> *)key_list;
  core::KeyData::KeyData((KeyData *)local_488);
  core::Descriptor::Parse
            ((Descriptor *)local_338,pubkey,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  core::Descriptor::GetKeyData((KeyData *)local_1c8,(Descriptor *)local_338);
  uVar1 = local_488._0_8_;
  local_488._0_8_ = local_1c8._0_8_;
  local_488._8_8_ = local_1c8._8_8_;
  local_488._16_8_ = local_1c8._16_8_;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1c8._16_8_ = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1);
  }
  uVar1 = local_488._24_8_;
  local_488._24_8_ = local_1c8._24_8_;
  local_488._32_8_ = puStack_1a8;
  local_488._40_8_ = local_1a0;
  local_1c8._24_8_ = (pointer)0x0;
  puStack_1a8 = (pointer)0x0;
  local_1a0 = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1);
  }
  uVar1 = local_488._56_8_;
  local_488._48_8_ = local_198;
  local_488._56_8_ = local_190;
  local_488._64_8_ = puStack_188;
  local_488._72_8_ = local_180;
  local_190 = (pointer)0x0;
  puStack_188 = (pointer)0x0;
  local_180 = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1);
  }
  uVar1 = local_488._96_8_;
  local_488._80_8_ = local_178;
  local_488[0x58] = uStack_170;
  local_488._89_3_ = uStack_16f;
  local_488._92_4_ = uStack_16c;
  local_488._96_8_ = local_168;
  local_488._104_8_ = puStack_160;
  local_488._112_8_ = local_158;
  local_168 = (pointer)0x0;
  puStack_160 = (pointer)0x0;
  local_158 = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1);
  }
  uVar1 = local_488._120_8_;
  local_488._120_8_ = local_150;
  local_488._128_8_ = puStack_148;
  local_488._136_8_ = local_140;
  local_150 = (pointer)0x0;
  puStack_148 = (pointer)0x0;
  local_140 = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1);
  }
  uVar1 = local_488._152_8_;
  local_488._144_8_ = local_138;
  local_488._152_8_ = local_130;
  local_488._160_8_ = puStack_128;
  local_488._168_8_ = local_120;
  local_130 = (pointer)0x0;
  puStack_128 = (pointer)0x0;
  local_120 = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1);
  }
  uVar1 = local_488._176_8_;
  local_488._176_8_ = local_118;
  local_488._184_8_ = pDStack_110;
  local_488._192_8_ = local_108;
  local_118 = (pointer)0x0;
  pDStack_110 = (pointer)0x0;
  local_108 = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1);
  }
  p_Var2 = _Stack_3b8._M_parent;
  local_488._200_8_ = local_100._0_8_;
  _Stack_3b8._M_color = local_100.super__Rb_tree_header._M_header._M_color;
  _Stack_3b8._4_4_ = local_100.super__Rb_tree_header._M_header._4_4_;
  _Stack_3b8._M_parent = local_100.super__Rb_tree_header._M_header._M_parent;
  _Stack_3b8._M_left = local_100.super__Rb_tree_header._M_header._M_left;
  _Stack_3b8._M_right = local_100.super__Rb_tree_header._M_header._M_right;
  local_100.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_100.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_100.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  if (p_Var2 != (_Base_ptr)0x0) {
    operator_delete(p_Var2);
  }
  puVar3 = local_398;
  local_398 = (pointer)local_100.super__Rb_tree_header._M_node_count;
  puStack_390 = puStack_d0;
  puStack_388 = local_c8;
  local_100.super__Rb_tree_header._M_node_count = 0;
  puStack_d0 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  puVar3 = local_380;
  local_380 = local_c0;
  puStack_378 = puStack_b8;
  puStack_370 = local_b0;
  local_c0 = (pointer)0x0;
  puStack_b8 = (pointer)0x0;
  local_b0 = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  puVar4 = local_368;
  local_368 = local_a8;
  puStack_360 = puStack_a0;
  pAStack_358 = local_98;
  local_a8 = (pointer)0x0;
  puStack_a0 = (pointer)0x0;
  local_98 = (pointer)0x0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  pAVar5 = local_350;
  local_350 = local_90;
  pAStack_348 = pAStack_88;
  puStack_340 = local_80;
  local_90 = (pointer)0x0;
  pAStack_88 = (pointer)0x0;
  local_80 = (pointer)0x0;
  if (pAVar5 != (pointer)0x0) {
    operator_delete(pAVar5);
  }
  core::KeyData::~KeyData((KeyData *)local_1c8);
  core::DescriptorNode::~DescriptorNode((DescriptorNode *)local_338);
  bVar6 = core::KeyData::IsValid((KeyData *)local_488);
  if (!bVar6) {
    core::KeyData::KeyData((KeyData *)local_338,pubkey,-1,false);
    uVar1 = local_488._0_8_;
    local_488._0_8_ = local_338._0_8_;
    local_488._8_8_ = local_338._8_8_;
    local_488._16_8_ = local_328._M_allocated_capacity;
    local_338._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_338._8_8_ = (pointer)0x0;
    local_328._M_allocated_capacity = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar1 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)uVar1);
    }
    uVar1 = local_488._24_8_;
    local_488._24_8_ = local_328._8_8_;
    local_488._32_8_ = _Stack_318._M_p;
    local_488._40_8_ = local_310;
    local_328._8_8_ = (pointer)0x0;
    _Stack_318._M_p = (pointer)0x0;
    local_310 = (pointer)0x0;
    if ((pointer)uVar1 != (pointer)0x0) {
      operator_delete((void *)uVar1);
    }
    uVar1 = local_488._56_8_;
    local_488._48_8_ = local_308._M_allocated_capacity;
    local_488._56_8_ = local_308._8_8_;
    local_488._64_8_ = _Stack_2f8._M_p;
    local_488._72_8_ = local_2f0;
    local_308._8_8_ = (pointer)0x0;
    _Stack_2f8._M_p = (pointer)0x0;
    local_2f0 = (pointer)0x0;
    if ((pointer)uVar1 != (pointer)0x0) {
      operator_delete((void *)uVar1);
    }
    uVar1 = local_488._96_8_;
    local_488._80_8_ = local_2e8._M_allocated_capacity;
    local_488._88_8_ = local_2e8._8_8_;
    local_488._96_8_ = local_2d8;
    local_488._104_8_ = _Stack_2d0._M_p;
    local_488._112_8_ = local_2c8;
    local_2d8 = (pointer)0x0;
    _Stack_2d0._M_p = (pointer)0x0;
    local_2c8 = (pointer)0x0;
    if ((pointer)uVar1 != (pointer)0x0) {
      operator_delete((void *)uVar1);
    }
    uVar1 = local_488._120_8_;
    local_488._120_8_ = local_2c0._M_allocated_capacity;
    local_488._128_8_ = local_2c0._8_8_;
    local_488._136_8_ = local_2b0._M_p;
    local_2c0._M_allocated_capacity = 0;
    local_2c0._8_8_ = (pointer)0x0;
    local_2b0._M_p = (pointer)0x0;
    if ((pointer)uVar1 != (pointer)0x0) {
      operator_delete((void *)uVar1);
    }
    uVar1 = local_488._152_8_;
    local_488._144_8_ = local_2a8;
    local_488._152_8_ = local_2a0._M_allocated_capacity;
    local_488._160_8_ = local_2a0._8_8_;
    local_488._168_8_ = local_290;
    local_2a0._M_allocated_capacity = 0;
    local_2a0._8_8_ = (pointer)0x0;
    local_290 = (pointer)0x0;
    if ((pointer)uVar1 != (pointer)0x0) {
      operator_delete((void *)uVar1);
    }
    uVar1 = local_488._176_8_;
    local_488._176_8_ = local_288;
    local_488._184_8_ = pDStack_280;
    local_488._192_8_ = local_278;
    local_288 = (pointer)0x0;
    pDStack_280 = (pointer)0x0;
    local_278 = (pointer)0x0;
    if ((pointer)uVar1 != (pointer)0x0) {
      operator_delete((void *)uVar1);
    }
    p_Var2 = _Stack_3b8._M_parent;
    local_488._200_8_ = local_270._0_8_;
    _Stack_3b8._M_color = local_270.super__Rb_tree_header._M_header._M_color;
    _Stack_3b8._4_4_ = local_270.super__Rb_tree_header._M_header._4_4_;
    _Stack_3b8._M_parent = local_270.super__Rb_tree_header._M_header._M_parent;
    _Stack_3b8._M_left = local_270.super__Rb_tree_header._M_header._M_left;
    _Stack_3b8._M_right = local_270.super__Rb_tree_header._M_header._M_right;
    local_270.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_270.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_270.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    if (p_Var2 != (_Base_ptr)0x0) {
      operator_delete(p_Var2);
    }
    puVar3 = local_398;
    local_398 = (pointer)local_270.super__Rb_tree_header._M_node_count;
    puStack_390 = (pointer)_Stack_240._M_p;
    puStack_388 = local_238;
    local_270.super__Rb_tree_header._M_node_count = 0;
    _Stack_240._M_p = (pointer)0x0;
    local_238 = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    puVar3 = local_380;
    local_380 = (pointer)local_230._M_allocated_capacity;
    puStack_378 = (pointer)local_230._8_8_;
    puStack_370 = local_220;
    local_230._M_allocated_capacity = 0;
    local_230._8_8_ = (pointer)0x0;
    local_220 = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    puVar4 = local_368;
    local_368 = local_218;
    puStack_360 = puStack_210;
    pAStack_358 = local_208;
    local_218 = (pointer)0x0;
    puStack_210 = (pointer)0x0;
    local_208 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    pAVar5 = local_350;
    local_350 = local_200;
    pAStack_348 = pAStack_1f8;
    puStack_340 = (pointer)local_1f0._M_p;
    local_200 = (pointer)0x0;
    pAStack_1f8 = (pointer)0x0;
    local_1f0._M_p = (pointer)0x0;
    if (pAVar5 != (pointer)0x0) {
      operator_delete(pAVar5);
    }
    core::KeyData::~KeyData((KeyData *)local_338);
  }
  core::KeyData::GetBip32Path_abi_cxx11_((string *)local_338,(KeyData *)local_488,kApostrophe,false)
  ;
  if ((pointer)local_338._8_8_ == (pointer)0x0) {
    bVar6 = true;
  }
  else {
    core::KeyData::GetFingerprint(&local_48,(KeyData *)local_488);
    sVar7 = core::ByteData::GetDataSize(&local_48);
    bVar6 = sVar7 != 4;
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._0_8_ != &local_328) {
    operator_delete((void *)local_338._0_8_);
  }
  if (bVar6) {
    bVar6 = IsEmptyString(fingerprint);
    if (bVar6) {
      local_338._0_8_ = "cfdcapi_psbt.cpp";
      local_338._8_4_ = 0xd7;
      local_328._M_allocated_capacity = 0x5f63ab;
      core::logger::log<>((CfdSourceLocation *)local_338,kCfdLogLevelWarning,
                          "fingerprint is null or empty.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_338._0_8_ = &local_328;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Failed to parameter. fingerprint is null or empty.","");
      core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_338);
      __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    bVar6 = IsEmptyString(bip32_path);
    if (bVar6) {
      local_338._0_8_ = "cfdcapi_psbt.cpp";
      local_338._8_4_ = 0xdd;
      local_328._M_allocated_capacity = 0x5f63ab;
      core::logger::log<>((CfdSourceLocation *)local_338,kCfdLogLevelWarning,
                          "bip32_path is null or empty.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_338._0_8_ = &local_328;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Failed to parameter. bip32_path is null or empty.","");
      core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_338);
      __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Pubkey::Pubkey(&local_60,pubkey);
    std::__cxx11::string::string((string *)local_338,bip32_path,&local_491);
    std::__cxx11::string::string((string *)local_1c8,fingerprint,&local_492);
    core::ByteData::ByteData(&local_78,(string *)local_1c8);
    std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
    emplace_back<cfd::core::Pubkey,std::__cxx11::string,cfd::core::ByteData>
              (local_490,&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
               &local_78);
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._0_8_ != &local_328) {
      operator_delete((void *)local_338._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00421be5;
  }
  else {
    core::KeyData::ToString_abi_cxx11_
              ((string *)local_338,(KeyData *)local_488,true,kApostrophe,false);
    std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
    emplace_back<std::__cxx11::string>
              (local_490,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
    local_60.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_338._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._0_8_ == &local_328) goto LAB_00421be5;
  }
  operator_delete(local_60.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_00421be5:
  core::KeyData::~KeyData((KeyData *)local_488);
  return;
}

Assistant:

static void ConvertToKeyData(
    const std::string& pubkey, const char* fingerprint, const char* bip32_path,
    std::vector<KeyData>* key_list) {
  KeyData key_data;
  try {
    auto desc = Descriptor::Parse(pubkey);
    key_data = desc.GetKeyData();
  } catch (const CfdException&) {
    // fall through
  }
  if (!key_data.IsValid()) key_data = KeyData(pubkey);

  if (key_data.GetBip32Path().empty() ||
      (key_data.GetFingerprint().GetDataSize() != 4)) {
    if (IsEmptyString(fingerprint)) {
      warn(CFD_LOG_SOURCE, "fingerprint is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fingerprint is null or empty.");
    }
    if (IsEmptyString(bip32_path)) {
      warn(CFD_LOG_SOURCE, "bip32_path is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. bip32_path is null or empty.");
    }
    key_list->emplace_back(
        Pubkey(pubkey), std::string(bip32_path), ByteData(fingerprint));
  } else {
    key_list->emplace_back(key_data.ToString());
  }
}